

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree.h
# Opt level: O2

void __thiscall
phmap::priv::
btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
::internal_clear(btree<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
                 *this,node_type *node)

{
  bool bVar1;
  byte bVar2;
  node_type *node_00;
  int i;
  size_type sVar3;
  
  node_00 = node;
  bVar1 = btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
          ::leaf(node);
  if (bVar1) {
    delete_leaf_node(this,node);
    return;
  }
  sVar3 = 0;
  while( true ) {
    bVar2 = btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
            ::count(node);
    if (bVar2 < sVar3) break;
    node_00 = btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
              ::child(node,sVar3);
    internal_clear(this,node_00);
    sVar3 = sVar3 + 1;
  }
  btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
  ::destroy(node,(allocator_type *)node_00);
  sVar3 = btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>
          ::InternalSize();
  Deallocate<8ul,phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>>
            (&(this->root_).
              super__Tuple_impl<0UL,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
              .
              super__Tuple_impl<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_phmap::priv::btree_node<phmap::priv::set_params<int,_std::less<int>,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_256,_true>_>_*>
              .
              super__Head_base<1UL,_phmap::priv::(anonymous_namespace)::PropagatingCountingAlloc<int>,_false>
              ._M_head_impl,node,sVar3);
  return;
}

Assistant:

void btree<P>::internal_clear(node_type *node) {
        if (!node->leaf()) {
            for (int i = 0; i <= node->count(); ++i) {
                internal_clear(node->child(i));
            }
            delete_internal_node(node);
        } else {
            delete_leaf_node(node);
        }
    }